

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

ssize_t __thiscall
stream::slice_reader::read(slice_reader *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  long lVar6;
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  seek(this,this->current_slice);
  uVar5 = 0;
  for (; 0 < (long)__buf; __buf = (void *)((long)__buf - lVar1)) {
    uVar2 = std::istream::tellg();
    if (this->slice_size < uVar2) break;
    if (this->slice_size == uVar2) {
      seek(this,this->current_slice + 1);
      uVar2 = std::istream::tellg();
      if (this->slice_size < uVar2) break;
    }
    plVar3 = (long *)std::istream::read((char *)this->is,lVar6);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    lVar1 = this->is->_M_gcount;
    uVar5 = uVar5 + lVar1;
    lVar6 = lVar6 + lVar1;
  }
  uVar4 = -(ulong)(uVar5 == 0) | uVar5;
  if (__buf == (void *)0x0) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

std::streamsize slice_reader::read(char * buffer, std::streamsize bytes) {
	
	seek(current_slice);
	
	std::streamsize nread = 0;
	
	while(bytes > 0) {
		
		boost::uint32_t read_pos = boost::uint32_t(is->tellg());
		if(read_pos > slice_size) {
			break;
		}
		boost::uint32_t remaining = slice_size - read_pos;
		if(!remaining) {
			seek(current_slice + 1);
			read_pos = boost::uint32_t(is->tellg());
			if(read_pos > slice_size) {
				break;
			}
			remaining = slice_size - read_pos;
		}
		
		boost::uint64_t toread = std::min(boost::uint64_t(remaining), boost::uint64_t(bytes));
		toread = std::min(toread, boost::uint64_t(std::numeric_limits<std::streamsize>::max()));
		if(is->read(buffer, std::streamsize(toread)).fail()) {
			break;
		}
		
		std::streamsize read = is->gcount();
		nread += read, buffer += read, bytes -= read;
	}
	
	return (nread != 0 || bytes == 0) ? nread : -1;
}